

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void bitrv2(int n,int *ip,double *a)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  *ip = 0;
  uVar7 = 1;
  while( true ) {
    if (n <= (int)(uVar7 * 8)) break;
    n = n >> 1;
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
      ip[(long)(int)uVar7 + uVar11] = ip[uVar11] + n;
    }
    uVar7 = uVar7 * 2;
  }
  iVar2 = uVar7 * 2;
  if (uVar7 * 8 == n) {
    lVar9 = 0;
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    iVar10 = uVar7 * 4;
    for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
      for (lVar16 = 0; lVar9 != lVar16; lVar16 = lVar16 + 2) {
        iVar8 = ip[uVar11] + (int)lVar16;
        lVar14 = (long)*(int *)((long)ip + lVar16 * 2) + (long)((int)uVar11 * 2);
        dVar3 = a[iVar8];
        dVar4 = (a + iVar8)[1];
        dVar5 = (a + lVar14)[1];
        a[iVar8] = a[lVar14];
        (a + iVar8)[1] = dVar5;
        a[lVar14] = dVar3;
        (a + lVar14)[1] = dVar4;
        iVar13 = (int)lVar14 + iVar10;
        dVar3 = a[iVar8 + iVar2];
        dVar4 = (a + (iVar8 + iVar2))[1];
        dVar5 = (a + iVar13)[1];
        a[iVar8 + iVar2] = a[iVar13];
        (a + (iVar8 + iVar2))[1] = dVar5;
        a[iVar13] = dVar3;
        (a + iVar13)[1] = dVar4;
        iVar13 = iVar13 + uVar7 * -2;
        dVar3 = a[iVar8 + iVar10];
        dVar4 = (a + (iVar8 + iVar10))[1];
        dVar5 = (a + iVar13)[1];
        a[iVar8 + iVar10] = a[iVar13];
        (a + (iVar8 + iVar10))[1] = dVar5;
        a[iVar13] = dVar3;
        (a + iVar13)[1] = dVar4;
        iVar8 = iVar8 + uVar7 * 6;
        dVar3 = a[iVar8];
        dVar4 = (a + iVar8)[1];
        dVar5 = (a + (iVar13 + iVar10))[1];
        a[iVar8] = a[iVar13 + iVar10];
        (a + iVar8)[1] = dVar5;
        a[iVar13 + iVar10] = dVar3;
        (a + (iVar13 + iVar10))[1] = dVar4;
      }
      lVar16 = (long)(int)((uVar7 + (int)uVar11) * 2) + (long)ip[uVar11];
      iVar8 = (int)lVar16 + iVar2;
      dVar3 = a[lVar16];
      dVar4 = (a + lVar16)[1];
      dVar5 = (a + iVar8)[1];
      a[lVar16] = a[iVar8];
      (a + lVar16)[1] = dVar5;
      a[iVar8] = dVar3;
      (a + iVar8)[1] = dVar4;
      lVar9 = lVar9 + 2;
    }
  }
  else {
    lVar16 = 4;
    for (lVar9 = 1; lVar9 < (int)uVar7; lVar9 = lVar9 + 1) {
      lVar12 = (long)ip[lVar9];
      lVar14 = lVar12 * 8 + (long)iVar2 * 8;
      for (lVar15 = 0; lVar16 != lVar15; lVar15 = lVar15 + 4) {
        lVar17 = (long)*(int *)((long)ip + lVar15) + (long)((int)lVar9 * 2);
        pdVar1 = (double *)((long)a + lVar15 * 4 + lVar12 * 8);
        dVar3 = *pdVar1;
        dVar4 = pdVar1[1];
        dVar5 = (a + lVar17)[1];
        pdVar1 = (double *)((long)a + lVar15 * 4 + lVar12 * 8);
        *pdVar1 = a[lVar17];
        pdVar1[1] = dVar5;
        a[lVar17] = dVar3;
        (a + lVar17)[1] = dVar4;
        iVar10 = (int)lVar17 + iVar2;
        pdVar1 = (double *)((long)a + lVar15 * 4 + lVar14);
        dVar3 = *pdVar1;
        dVar4 = pdVar1[1];
        dVar5 = (a + iVar10)[1];
        pdVar1 = (double *)((long)a + lVar15 * 4 + lVar14);
        *pdVar1 = a[iVar10];
        pdVar1[1] = dVar5;
        a[iVar10] = dVar3;
        (a + iVar10)[1] = dVar4;
      }
      lVar16 = lVar16 + 4;
    }
  }
  return;
}

Assistant:

void bitrv2(int n, int *ip, double *a)
{
    int j, j1, k, k1, l, m, m2;
    double xr, xi, yr, yi;
    
    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}